

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.h
# Opt level: O1

wav_basis_norms_static<16> * idx2::GetCdf53NormsFast<16>(void)

{
  wav_basis_norms_static<16> *in_RDI;
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  
  lVar1 = 0;
  (in_RDI->ScalNorms).Len = '\0';
  (in_RDI->ScalNorms).Arr[0xc] = 0.0;
  (in_RDI->ScalNorms).Arr[0xd] = 0.0;
  (in_RDI->ScalNorms).Arr[0xe] = 0.0;
  (in_RDI->ScalNorms).Arr[0xf] = 0.0;
  (in_RDI->ScalNorms).Arr[8] = 0.0;
  (in_RDI->ScalNorms).Arr[9] = 0.0;
  (in_RDI->ScalNorms).Arr[10] = 0.0;
  (in_RDI->ScalNorms).Arr[0xb] = 0.0;
  (in_RDI->ScalNorms).Arr[4] = 0.0;
  (in_RDI->ScalNorms).Arr[5] = 0.0;
  (in_RDI->ScalNorms).Arr[6] = 0.0;
  (in_RDI->ScalNorms).Arr[7] = 0.0;
  (in_RDI->ScalNorms).Arr[0] = 0.0;
  (in_RDI->ScalNorms).Arr[1] = 0.0;
  (in_RDI->ScalNorms).Arr[2] = 0.0;
  (in_RDI->ScalNorms).Arr[3] = 0.0;
  (in_RDI->WaveNorms).Arr[0] = 0.0;
  (in_RDI->WaveNorms).Arr[1] = 0.0;
  (in_RDI->WaveNorms).Arr[2] = 0.0;
  (in_RDI->WaveNorms).Arr[3] = 0.0;
  (in_RDI->WaveNorms).Arr[4] = 0.0;
  (in_RDI->WaveNorms).Arr[5] = 0.0;
  (in_RDI->WaveNorms).Arr[6] = 0.0;
  (in_RDI->WaveNorms).Arr[7] = 0.0;
  (in_RDI->WaveNorms).Arr[8] = 0.0;
  (in_RDI->WaveNorms).Arr[9] = 0.0;
  (in_RDI->WaveNorms).Arr[10] = 0.0;
  (in_RDI->WaveNorms).Arr[0xb] = 0.0;
  (in_RDI->WaveNorms).Arr[0xc] = 0.0;
  (in_RDI->WaveNorms).Arr[0xd] = 0.0;
  (in_RDI->WaveNorms).Arr[0xe] = 0.0;
  (in_RDI->WaveNorms).Arr[0xf] = 0.0;
  (in_RDI->WaveNorms).Len = '\0';
  dVar6 = 3.0;
  dVar5 = 23.0;
  do {
    auVar3._0_8_ = dVar6 / (double)(2 << ((byte)lVar1 & 0x1f));
    auVar3._8_8_ = 0;
    if (auVar3._0_8_ < 0.0) {
      dVar2 = sqrt(auVar3._0_8_);
    }
    else {
      auVar3 = vsqrtsd_avx(auVar3,auVar3);
      dVar2 = auVar3._0_8_;
    }
    (in_RDI->ScalNorms).Arr[lVar1] = dVar2;
    dVar6 = dVar6 * 4.0 + -1.0;
    auVar4._0_8_ = dVar5 / (double)(0x20 << ((byte)lVar1 & 0x1f));
    auVar4._8_8_ = 0;
    if (auVar4._0_8_ < 0.0) {
      dVar2 = sqrt(auVar4._0_8_);
    }
    else {
      auVar3 = vsqrtsd_avx(auVar4,auVar4);
      dVar2 = auVar3._0_8_;
    }
    (in_RDI->WaveNorms).Arr[lVar1] = dVar2;
    lVar1 = lVar1 + 1;
    dVar5 = dVar5 * 4.0 + -33.0;
  } while (lVar1 != 0x10);
  return in_RDI;
}

Assistant:

wav_basis_norms_static<N>
GetCdf53NormsFast()
{
  wav_basis_norms_static<N> Result;
  f64 Num1 = 3, Num2 = 23;
  for (int I = 0; I < N; ++I)
  {
    Result.ScalNorms[I] = sqrt(Num1 / (1 << (I + 1)));
    Num1 = Num1 * 4 - 1;
    Result.WaveNorms[I] = sqrt(Num2 / (1 << (I + 5)));
    Num2 = Num2 * 4 - 33;
  }
  return Result;
}